

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UTF8CoerceToStructurallyValid
          (internal *this,StringPiece src_str,char *idst,char replace_char)

{
  int iVar1;
  internal *__dest;
  stringpiece_ssize_type extraout_RDX;
  internal *piVar2;
  internal *piVar3;
  size_t sVar4;
  internal *piVar5;
  StringPiece str;
  StringPiece str2;
  StringPiece local_40;
  
  __dest = (internal *)src_str.length_;
  iVar1 = UTF8SpnStructurallyValid(this,src_str);
  piVar3 = this;
  if (iVar1 != (int)src_str.ptr_) {
    sVar4 = (size_t)iVar1;
    memmove(__dest,this,sVar4);
    piVar5 = __dest + sVar4;
    for (piVar2 = this + sVar4; piVar3 = __dest, piVar2 < this + (int)src_str.ptr_;
        piVar2 = piVar2 + sVar4 + 1) {
      *piVar5 = SUB81(idst,0);
      piVar3 = piVar2 + 1;
      StringPiece::StringPiece
                (&local_40,(char *)piVar3,(long)(this + (int)src_str.ptr_) - (long)piVar3);
      str.length_ = extraout_RDX;
      str.ptr_ = (char *)local_40.length_;
      iVar1 = UTF8SpnStructurallyValid((internal *)local_40.ptr_,str);
      sVar4 = (size_t)iVar1;
      memmove(piVar5 + 1,piVar3,sVar4);
      piVar5 = piVar5 + sVar4 + 1;
    }
  }
  return (char *)piVar3;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}